

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_tcp.cpp
# Opt level: O1

bool __thiscall miniros::TransportTCP::setNonBlocking(TransportTCP *this)

{
  int iVar1;
  string local_48;
  
  if (((this->flags_ & 1) == 0) && (iVar1 = set_non_blocking(&this->sock_), iVar1 != 0)) {
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (setNonBlocking::loc.initialized_ == false) {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"miniros.transport_tcp","");
      console::initializeLogLocation(&setNonBlocking::loc,&local_48,Error);
      setNonBlocking();
    }
    if (setNonBlocking::loc.level_ != Error) {
      setNonBlocking();
    }
    if (setNonBlocking::loc.logger_enabled_ == true) {
      setNonBlocking();
    }
    (*(this->super_Transport)._vptr_Transport[8])(this);
    if (iVar1 != 0) {
      return false;
    }
  }
  return true;
}

Assistant:

bool TransportTCP::setNonBlocking()
{
  if (!(flags_ & SYNCHRONOUS))
  {
	  int result = set_non_blocking(sock_);
	  if ( result != 0 ) {
	      MINIROS_ERROR("setting socket [%d] as non_blocking failed with error [%d]", sock_, result);
      close();
      return false;
    }
  }

  return true;
}